

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbBLTargetOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  int32_t iVar2;
  uint in_ESI;
  MCInst *in_RDI;
  int imm32;
  uint tmp;
  uint I2;
  uint I1;
  uint J2;
  uint J1;
  uint S;
  
  uVar1 = in_ESI >> 0x17 & 1;
  iVar2 = SignExtend32((in_ESI & 0xff9fffff |
                        (uint)(((in_ESI >> 0x16 & 1) != uVar1 ^ 0xffU) & 1) << 0x16 |
                       (uint)(((in_ESI >> 0x15 & 1) != uVar1 ^ 0xffU) & 1) << 0x15) << 1,0x19);
  MCOperand_CreateImm0(in_RDI,(long)iVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeThumbBLTargetOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	// Val is passed in as S:J1:J2:imm10:imm11
	// Note no trailing zero after imm11.  Also the J1 and J2 values are from
	// the encoded instruction.  So here change to I1 and I2 values via:
	// I1 = NOT(J1 EOR S);
	// I2 = NOT(J2 EOR S);
	// and build the imm32 with one trailing zero as documented:
	// imm32 = SignExtend(S:I1:I2:imm10:imm11:'0', 32);
	unsigned S = (Val >> 23) & 1;
	unsigned J1 = (Val >> 22) & 1;
	unsigned J2 = (Val >> 21) & 1;
	unsigned I1 = !(J1 ^ S);
	unsigned I2 = !(J2 ^ S);
	unsigned tmp = (Val & ~0x600000) | (I1 << 22) | (I2 << 21);
	int imm32 = SignExtend32(tmp << 1, 25);

	MCOperand_CreateImm0(Inst, imm32);
	return MCDisassembler_Success;
}